

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# producer.cpp
# Opt level: O2

void __thiscall pcplusplus::threads::producer_threads::thread_routine(producer_threads *this)

{
  size_t *psVar1;
  queue<long> *pqVar2;
  char cVar3;
  ostream *poVar4;
  long num;
  char *__stat_loc;
  duration<long,_std::ratio<1L,_1000000L>_> local_48;
  timespec ts;
  
  syscall(0xba);
  generic_threads::lock(&this->super_generic_threads);
  poVar4 = std::operator<<((ostream *)&std::cout,"Producer thread ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  __stat_loc = " started.";
  poVar4 = std::operator<<(poVar4," started.");
  std::endl<char,std::char_traits<char>>(poVar4);
  generic_threads::unlock(&this->super_generic_threads);
  while ((this->super_generic_threads).num_processed < (this->super_generic_threads).target) {
    local_48.__r = 5;
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_48);
    generic_threads::lock(&this->super_generic_threads);
    while (pqVar2 = (this->super_generic_threads).buffer, pqVar2->current_size == pqVar2->capacity)
    {
      generic_threads::wait(&this->super_generic_threads,__stat_loc);
    }
    if ((this->super_generic_threads).num_processed == (this->super_generic_threads).target)
    goto LAB_00103dcf;
    num = lrand48();
    __stat_loc = (char *)queue<long>::enqueue((this->super_generic_threads).buffer,num);
    timespec_get(&ts,1);
    cVar3 = std::__basic_file<char>::is_open();
    if ((cVar3 != '\0') &&
       (((&(this->super_generic_threads).field_0x80)
         [*(long *)(*(long *)&(this->super_generic_threads).logfile + -0x18)] & 5) == 0)) {
      poVar4 = std::ostream::_M_insert<long>((long)&(this->super_generic_threads).logfile);
      poVar4 = std::operator<<(poVar4,0x30);
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 9;
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0;
      poVar4 = std::operator<<(poVar4," Producer ");
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Producer thread ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," produced ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," and stored it at index ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    psVar1 = &(this->super_generic_threads).num_processed;
    *psVar1 = *psVar1 + 1;
    generic_threads::unlock(&this->super_generic_threads);
    generic_threads::notify(&this->super_generic_threads);
  }
  generic_threads::lock(&this->super_generic_threads);
LAB_00103dcf:
  poVar4 = std::operator<<((ostream *)&std::cout,"Producer thread ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," finished.");
  std::endl<char,std::char_traits<char>>(poVar4);
  generic_threads::unlock(&this->super_generic_threads);
  return;
}

Assistant:

void producer_threads::thread_routine(){
	const auto thread_id = GET_TID;
	struct timespec ts;
	lock();
	std::cout << "Producer thread " << thread_id << " started." << std::endl;
	unlock();
	while(num_processed < target){
	    std::this_thread::sleep_for(std::chrono::microseconds(5));//sleep for 5 microseconds so that other producer threads have an opportunity to acquire the mutex
	    lock();
	    while(buffer->isFull()){
		wait();
	    }
	    if(num_processed == target){
		std::cout << "Producer thread " << thread_id << " finished." << std::endl;
		unlock();
		return;
	    }

	    const long num = lrand48();
	    const size_t index = buffer->enqueue(num);
	    timespec_get(&ts, TIME_UTC);
	    if(logfile.is_open() && logfile)
		logfile << ts.tv_sec << std::setfill('0') << std::setw(9) << ts.tv_nsec << std::setw(0) << " Producer " << thread_id << " " << index << " " << num << std::endl;

	    std::cout << "Producer thread " << thread_id << " produced " << num << " and stored it at index " << index << std::endl;
	    ++num_processed;
	    unlock();
	    notify();
	}
	lock();
	std::cout << "Producer thread " << thread_id << " finished." << std::endl;
	unlock();
    }